

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::Simple9<true,_false>::decodeArray
          (Simple9<true,_false> *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  NotEnoughStorage *this_00;
  size_t extraout_RDX;
  ulong uVar1;
  uint *local_30;
  uint32_t *local_28;
  
  uVar1 = (ulong)*in;
  local_28 = out;
  if (uVar1 <= *nvalue) {
    local_30 = in + 1;
    *nvalue = uVar1;
    if (uVar1 != 0) {
      do {
        (**(code **)(Simple9<true,false>::unpackarray + (ulong)(*local_30 >> 0x1c) * 8))
                  (&local_28,&local_30,param_2);
        param_2 = extraout_RDX;
      } while (local_28 < out + uVar1);
    }
    return local_30;
  }
  local_30 = in;
  this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
  NotEnoughStorage::NotEnoughStorage(this_00,(ulong)*local_30);
  __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const uint32_t *
Simple9<MarkLength, hacked>::decodeArray(const uint32_t *in, const size_t /* len */,
                                         uint32_t *out, size_t &nvalue) {
#endif
  if (MarkLength)
    if ((*in) > nvalue)
      throw NotEnoughStorage(*in);
  const uint32_t actualvalue = MarkLength ? *(in++) : (uint32_t)nvalue;
  if (nvalue < actualvalue)
    fprintf(stderr, "possible overrun\n");
  nvalue = actualvalue;
  const uint32_t *const end = out + nvalue;
  while (end > out) {
#ifdef STATS
    stats[which(in)]++;
    expectedlength += lengths[which(in)];
#endif
    // while (in < endin) {
    (unpackarray[which(in)])(&out, &in);
  }

#ifdef STATS
  uint32_t sum = std::accumulate(stats.begin(), stats.end(), 0);

  for (uint32_t k = 0; k < stats.size(); ++k) {
    printf("simple9 stats[k=%u]=%f\n", k, stats[k] * 1.0 / sum);
  }
  printf("alt computed length %u\n", sum);
  printf("computed length = %zu\n", expectedlength);
  printf("we compressed %zu integers down to %zu 32-bit words\n", nvalue, len);
#endif
  return in;
}